

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O3

FT_ULong ft_lzwstate_io(FT_LzwState state,FT_Byte *buffer,FT_ULong out_size)

{
  FT_Byte FVar1;
  FT_LzwPhase FVar2;
  FT_Error FVar3;
  FT_UInt FVar4;
  int iVar5;
  FT_ULong FVar6;
  ulong uVar7;
  FT_UShort *pFVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  ulong new_count;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  FT_Byte max_bits;
  FT_Error error;
  byte local_51;
  undefined8 local_50;
  FT_Byte *local_48;
  FT_ULong local_40;
  int local_34;
  
  uVar14 = state->old_code;
  uVar12 = state->old_char;
  uVar13 = state->in_code;
  if (out_size == 0) {
    local_40 = 0;
    goto LAB_0026e7f0;
  }
  FVar2 = state->phase;
  FVar6 = 0;
  local_40 = out_size;
  local_48 = buffer;
  if (FVar2 == FT_LZW_PHASE_STACK) goto LAB_0026e7c4;
  if (FVar2 == FT_LZW_PHASE_CODE) {
    local_50 = CONCAT44(local_50._4_4_,uVar13);
LAB_0026e67b:
    while (uVar13 = ft_lzwstate_get_code(state), -1 < (int)uVar13) {
      while (uVar10 = uVar13, uVar13 == 0x100) {
        if (state->block_mode == 0) goto LAB_0026e6e1;
        state->free_ent = 0;
        state->buf_clear = '\x01';
        uVar13 = ft_lzwstate_get_code(state);
        uVar14 = 0;
        uVar12 = 0;
        if ((int)uVar13 < 0) goto LAB_0026e6c6;
      }
      if (0xff < uVar13) {
LAB_0026e6e1:
        if (state->free_ent <= uVar13 - 0x100) {
          if (state->free_ent < uVar13 - 0x100) goto LAB_0026e6cd;
          uVar10 = state->stack_top;
          uVar7 = (ulong)uVar10;
          if (state->stack_size <= uVar7) {
            iVar5 = ft_lzwstate_stack_grow(state);
            if (iVar5 < 0) goto LAB_0026e6cd;
            uVar10 = state->stack_top;
            uVar7 = (ulong)uVar10;
          }
          state->stack_top = uVar10 + 1;
          state->stack[uVar7] = (FT_Byte)uVar12;
          uVar10 = uVar14;
          if (uVar14 < 0x100) goto LAB_0026e784;
        }
        pFVar8 = state->prefix;
        do {
          if (pFVar8 == (FT_UShort *)0x0) goto LAB_0026e6cd;
          uVar11 = state->stack_top;
          uVar7 = (ulong)uVar11;
          if (state->stack_size <= uVar7) {
            iVar5 = ft_lzwstate_stack_grow(state);
            if (iVar5 < 0) goto LAB_0026e6cd;
            uVar11 = state->stack_top;
            uVar7 = (ulong)uVar11;
          }
          FVar1 = state->suffix[uVar10 - 0x100];
          state->stack_top = uVar11 + 1;
          state->stack[uVar7] = FVar1;
          pFVar8 = state->prefix;
          uVar10 = (uint)pFVar8[uVar10 - 0x100];
        } while (0xff < uVar10);
      }
LAB_0026e784:
      uVar12 = uVar10;
      uVar10 = state->stack_top;
      uVar7 = (ulong)uVar10;
      if (state->stack_size <= uVar7) {
        iVar5 = ft_lzwstate_stack_grow(state);
        if (iVar5 < 0) goto LAB_0026e6cd;
        uVar10 = state->stack_top;
        uVar7 = (ulong)uVar10;
      }
      state->stack_top = uVar10 + 1;
      state->stack[uVar7] = (FT_Byte)uVar12;
      state->phase = FT_LZW_PHASE_STACK;
LAB_0026e7c4:
      while( true ) {
        if (state->stack_top == 0) break;
        uVar10 = state->stack_top - 1;
        state->stack_top = uVar10;
        if (local_48 != (FT_Byte *)0x0) {
          local_48[FVar6] = state->stack[uVar10];
        }
        FVar6 = FVar6 + 1;
        if (local_40 == FVar6) goto LAB_0026e7f0;
      }
      uVar10 = state->free_ent;
      if (uVar10 < state->max_free) {
        uVar11 = state->prefix_size;
        uVar7 = (ulong)uVar11;
        if (uVar11 <= uVar10) {
          new_count = 0x200;
          if (uVar7 != 0) {
            new_count = (ulong)((uVar11 >> 2) + uVar11);
          }
          local_50 = uVar7;
          pFVar8 = (FT_UShort *)
                   ft_mem_realloc(state->memory,3,uVar7,new_count,state->prefix,&local_34);
          state->prefix = pFVar8;
          if (local_34 != 0) goto LAB_0026e6cd;
          state->suffix = (FT_Byte *)(pFVar8 + new_count);
          memmove(pFVar8 + new_count,pFVar8 + local_50,local_50);
          state->prefix_size = (FT_UInt)new_count;
          uVar10 = state->free_ent;
        }
        state->prefix[uVar10] = (FT_UShort)uVar14;
        state->suffix[uVar10] = (FT_Byte)uVar12;
        state->free_ent = state->free_ent + 1;
      }
      state->phase = FT_LZW_PHASE_CODE;
      local_50 = CONCAT44(local_50._4_4_,uVar13);
      uVar14 = uVar13;
    }
LAB_0026e6c6:
    uVar13 = (uint)local_50;
  }
  else {
    local_40 = FVar6;
    if (FVar2 != FT_LZW_PHASE_START) goto LAB_0026e7f0;
    local_40 = out_size;
    FVar3 = FT_Stream_Seek(state->source,2);
    if ((FVar3 == 0) && (FVar6 = FT_Stream_TryRead(state->source,&local_51,1), FVar6 == 1)) {
      uVar10 = local_51 & 0x1f;
      state->max_bits = uVar10;
      bVar9 = (byte)uVar10;
      state->block_mode = local_51 & 0xffffff80;
      state->max_free = (1 << bVar9) - 0x100;
      if (bVar9 < 0x11) {
        state->num_bits = 9;
        state->free_ent = (uint)(local_51 >> 7);
        FVar4 = 0x100;
        if (bVar9 < 10) {
          FVar4 = (1 << bVar9) - 0xff;
        }
        state->free_bits = FVar4;
        uVar10 = ft_lzwstate_get_code(state);
        uVar13 = 0;
        if (uVar10 < 0x100) {
          if (local_48 != (FT_Byte *)0x0) {
            *local_48 = (FT_Byte)uVar10;
          }
          uVar14 = uVar10;
          uVar12 = uVar10;
          if (local_40 == 1) {
            local_40 = 1;
            uVar13 = 0;
            goto LAB_0026e7f0;
          }
          state->phase = FT_LZW_PHASE_CODE;
          FVar6 = 1;
          local_50 = (ulong)local_50._4_4_ << 0x20;
          goto LAB_0026e67b;
        }
      }
    }
    FVar6 = 0;
  }
LAB_0026e6cd:
  local_40 = FVar6;
  state->phase = FT_LZW_PHASE_EOF;
LAB_0026e7f0:
  state->old_code = uVar14;
  state->old_char = uVar12;
  state->in_code = uVar13;
  return local_40;
}

Assistant:

FT_LOCAL_DEF( FT_ULong )
  ft_lzwstate_io( FT_LzwState  state,
                  FT_Byte*     buffer,
                  FT_ULong     out_size )
  {
    FT_ULong  result = 0;

    FT_UInt  old_char = state->old_char;
    FT_UInt  old_code = state->old_code;
    FT_UInt  in_code  = state->in_code;


    if ( out_size == 0 )
      goto Exit;

    switch ( state->phase )
    {
    case FT_LZW_PHASE_START:
      {
        FT_Byte   max_bits;
        FT_Int32  c;


        /* skip magic bytes, and read max_bits + block_flag */
        if ( FT_Stream_Seek( state->source, 2 ) != 0               ||
             FT_Stream_TryRead( state->source, &max_bits, 1 ) != 1 )
          goto Eof;

        state->max_bits   = max_bits & LZW_BIT_MASK;
        state->block_mode = max_bits & LZW_BLOCK_MASK;
        state->max_free   = (FT_UInt)( ( 1UL << state->max_bits ) - 256 );

        if ( state->max_bits > LZW_MAX_BITS )
          goto Eof;

        state->num_bits = LZW_INIT_BITS;
        state->free_ent = ( state->block_mode ? LZW_FIRST
                                              : LZW_CLEAR ) - 256;
        in_code  = 0;

        state->free_bits = state->num_bits < state->max_bits
                           ? (FT_UInt)( ( 1UL << state->num_bits ) - 256 )
                           : state->max_free + 1;

        c = ft_lzwstate_get_code( state );
        if ( c < 0 || c > 255 )
          goto Eof;

        old_code = old_char = (FT_UInt)c;

        if ( buffer )
          buffer[result] = (FT_Byte)old_char;

        if ( ++result >= out_size )
          goto Exit;

        state->phase = FT_LZW_PHASE_CODE;
      }
      FALL_THROUGH;

    case FT_LZW_PHASE_CODE:
      {
        FT_Int32  c;
        FT_UInt   code;


      NextCode:
        c = ft_lzwstate_get_code( state );
        if ( c < 0 )
          goto Eof;

        code = (FT_UInt)c;

        if ( code == LZW_CLEAR && state->block_mode )
        {
          /* why not LZW_FIRST-256 ? */
          state->free_ent  = ( LZW_FIRST - 1 ) - 256;
          state->buf_clear = 1;

          /* not quite right, but at least more predictable */
          old_code = 0;
          old_char = 0;

          goto NextCode;
        }

        in_code = code; /* save code for later */

        if ( code >= 256U )
        {
          /* special case for KwKwKwK */
          if ( code - 256U >= state->free_ent )
          {
            /* corrupted LZW stream */
            if ( code - 256U > state->free_ent )
              goto Eof;

            FTLZW_STACK_PUSH( old_char );
            code = old_code;
          }

          while ( code >= 256U )
          {
            if ( !state->prefix )
              goto Eof;

            FTLZW_STACK_PUSH( state->suffix[code - 256] );
            code = state->prefix[code - 256];
          }
        }

        old_char = code;
        FTLZW_STACK_PUSH( old_char );

        state->phase = FT_LZW_PHASE_STACK;
      }
      FALL_THROUGH;

    case FT_LZW_PHASE_STACK:
      {
        while ( state->stack_top > 0 )
        {
          state->stack_top--;

          if ( buffer )
            buffer[result] = state->stack[state->stack_top];

          if ( ++result == out_size )
            goto Exit;
        }

        /* now create new entry */
        if ( state->free_ent < state->max_free )
        {
          if ( state->free_ent >= state->prefix_size &&
               ft_lzwstate_prefix_grow( state ) < 0  )
            goto Eof;

          FT_ASSERT( state->free_ent < state->prefix_size );

          state->prefix[state->free_ent] = (FT_UShort)old_code;
          state->suffix[state->free_ent] = (FT_Byte)  old_char;

          state->free_ent += 1;
        }

        old_code = in_code;

        state->phase = FT_LZW_PHASE_CODE;
        goto NextCode;
      }

    default:  /* state == EOF */
      ;
    }

  Exit:
    state->old_code = old_code;
    state->old_char = old_char;
    state->in_code  = in_code;

    return result;

  Eof:
    state->phase = FT_LZW_PHASE_EOF;
    goto Exit;
  }